

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O1

void la_miam_file_transfer_request_format_text(la_vstring *vstr,void *data,int indent)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = indent + 1;
  la_vstring_append_sprintf
            (vstr,"%*sFile ID: %u\n",(ulong)uVar2,"",(ulong)*(ushort *)((long)data + 8));
  la_vstring_append_sprintf(vstr,"%*sFile size: %zu bytes\n",(ulong)uVar2,"",*data);
  la_vstring_append_sprintf
            (vstr,"%*sComplete until: %d-%02d-%02d %02d:%02d:%02d\n",(ulong)uVar2,"",
             (ulong)(*(int *)((long)data + 0x24) + 0x76c),(ulong)(*(int *)((long)data + 0x20) + 1),
             (ulong)*(uint *)((long)data + 0x1c),(ulong)*(uint *)((long)data + 0x18),
             (ulong)*(uint *)((long)data + 0x14),(ulong)*(uint *)((long)data + 0x10));
  pcVar1 = la_reasm_status_name_get(*(la_reasm_status *)((long)data + 0x48));
  la_vstring_append_sprintf(vstr,"%*sReassembly: %s\n",(ulong)uVar2,"",pcVar1);
  return;
}

Assistant:

static void la_miam_file_transfer_request_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_transfer_request_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	LA_ISPRINTF(vstr, indent, "File size: %zu bytes\n", msg->file_size);
	struct tm const *t = &msg->validity_time;
	LA_ISPRINTF(vstr, indent, "Complete until: %d-%02d-%02d %02d:%02d:%02d\n",
			t->tm_year + 1900, t->tm_mon + 1, t->tm_mday,
			t->tm_hour, t->tm_min, t->tm_sec
			);
	LA_ISPRINTF(vstr, indent, "Reassembly: %s\n", la_reasm_status_name_get(msg->reasm_status));
}